

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O3

uint fl_ucs_to_Utf16(uint ucs,unsigned_short *dst,uint dstlen)

{
  uint uVar1;
  unsigned_short *puVar2;
  unsigned_short *puVar3;
  unsigned_short u16 [4];
  
  puVar3 = u16;
  if (dstlen != 0) {
    puVar3 = dst;
  }
  if (dst == (unsigned_short *)0x0) {
    puVar3 = u16;
  }
  if (ucs < 0x110000 && (ucs & 0x1ff800) != 0xd800) {
    if (0xffff < ucs) {
      if (dstlen < 2) {
        *puVar3 = 0xfffd;
      }
      else {
        *puVar3 = (ushort)(ucs + 0xf0000 >> 10) & 0x3ff | 0xd800;
        puVar2 = u16;
        if (dst != (unsigned_short *)0x0) {
          puVar2 = dst;
        }
        puVar2[1] = (ushort)ucs & 0x3ff | 0xdc00;
      }
      uVar1 = 2;
      goto LAB_001fe054;
    }
    *puVar3 = (ushort)ucs;
  }
  else {
    *puVar3 = 0xfffd;
  }
  uVar1 = 1;
LAB_001fe054:
  if (uVar1 < dstlen) {
    puVar3[uVar1] = 0;
  }
  return uVar1;
}

Assistant:

unsigned fl_ucs_to_Utf16(const unsigned ucs, unsigned short *dst, const unsigned dstlen)
{
  /* The rule for direct conversion from UCS to UTF16 is:
   * - if UCS >  0x0010FFFF then UCS is invalid
   * - if UCS >= 0xD800 && UCS <= 0xDFFF UCS is invalid
   * - if UCS <= 0x0000FFFF then U16 = UCS, len = 1
   * - else
   * -- U16[0] = ((UCS - 0x00010000) >> 10) & 0x3FF + 0xD800
   * -- U16[1] = (UCS & 0x3FF) + 0xDC00
   * -- len = 2;
   */
  unsigned count;        /* Count of converted UTF16 cells */
  unsigned short u16[4]; /* Alternate buffer if dst is not set */
  unsigned short *out;   /* points to the active buffer */
  /* Ensure we have a valid buffer to write to */
  if((!dstlen) || (!dst)) {
    out = u16;
  } else {
    out = dst;
  }
  /* Convert from UCS to UTF16 */
  if((ucs > 0x0010FFFF) || /* UCS is too large */
  ((ucs > 0xD7FF) && (ucs < 0xE000))) { /* UCS in invalid range */
    out[0] = 0xFFFD; /* REPLACEMENT CHARACTER */
    count = 1;
  } else if(ucs < 0x00010000) {
    out[0] = (unsigned short)ucs;
    count = 1;
  } else if(dstlen < 2) { /* dst is too small for the result */
    out[0] = 0xFFFD; /* REPLACEMENT CHARACTER */
    count = 2;
  } else {
    out[0] = (((ucs - 0x00010000) >> 10) & 0x3FF) + 0xD800;
    out[1] = (ucs & 0x3FF) + 0xDC00;
    count = 2;
  }
  /* NULL terminate the output, if there is space */
  if(count < dstlen) { out[count] = 0; }
  return count;
}